

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automations.cpp
# Opt level: O3

void __thiscall rtosc::AutomationMgr::clearSlotSub(AutomationMgr *this,int slot_id,int sub)

{
  Automation *pAVar1;
  
  if ((((-1 < slot_id) && (slot_id < this->nslots)) && (-1 < sub)) && (sub < this->per_slot)) {
    pAVar1 = this->slots[(uint)slot_id].automations + (uint)sub;
    pAVar1->used = false;
    pAVar1->active = false;
    pAVar1->relative = false;
    pAVar1->param_min = 0.0;
    pAVar1->param_max = 0.0;
    pAVar1->param_step = 0.0;
    memset(&pAVar1->param_base_value,0,0x85);
    (pAVar1->map).gain = 100.0;
    (pAVar1->map).offset = 0.0;
    this->damaged = 1;
  }
  return;
}

Assistant:

void AutomationMgr::clearSlotSub(int slot_id, int sub)
{
    if(slot_id >= nslots || slot_id < 0 || sub >= per_slot || sub < 0)
        return;
    auto &a = slots[slot_id].automations[sub];
    a.used    = false;
    a.active  = false;
    a.relative = false;
    a.param_base_value = false;
    memset(a.param_path, 0, sizeof(a.param_path));
    a.param_type = 0;
    a.param_min  = 0;
    a.param_max  = 0;
    a.param_step = 0;
    a.map.gain   = 100;
    a.map.offset = 0;

    damaged = true;
}